

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_GammaCorrection(GammaCorrectionForm3 GammaCorrection)

{
  bool bVar1;
  uint uVar2;
  code *in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [16];
  uint8_t corrected;
  double value;
  Image output;
  double gamma;
  double a;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  uint8_t intensity;
  uint32_t in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff0c;
  undefined1 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff11;
  undefined1 in_stack_ffffffffffffff12;
  byte bVar6;
  undefined1 in_stack_ffffffffffffff13;
  undefined2 in_stack_ffffffffffffff14;
  ushort uVar7;
  uint8_t in_stack_ffffffffffffff16;
  undefined1 uVar8;
  uint8_t in_stack_ffffffffffffff17;
  undefined1 uVar9;
  uint32_t *in_stack_ffffffffffffff18;
  double dVar10;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar11;
  uint32_t height;
  uint32_t in_stack_ffffffffffffff38;
  uint8_t in_stack_ffffffffffffff3f;
  undefined1 local_b8 [40];
  double local_90;
  double local_88;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined1 local_60 [40];
  undefined1 local_38 [47];
  byte local_9;
  code *local_8;
  
  auVar5 = in_ZMM0._0_16_;
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  uVar2 = (uint)local_9;
  height = (uint32_t)((ulong)local_60 >> 0x20);
  uVar11 = 0;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff18,in_stack_ffffffffffffff17,in_stack_ffffffffffffff16
            );
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38,height,
             (Image *)CONCAT44(uVar11,uVar2));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d5fe5);
  Unit_Test::generateRoi
            ((Image *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,
             (uint32_t *)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,
                               CONCAT24(in_stack_ffffffffffffff14,
                                        CONCAT13(in_stack_ffffffffffffff13,
                                                 CONCAT12(in_stack_ffffffffffffff12,
                                                          CONCAT11(in_stack_ffffffffffffff11,
                                                                   in_stack_ffffffffffffff10)))))),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (uint32_t *)0x1d600f);
  uVar2 = Test_Helper::randomValue<unsigned_int>(0x1d601b);
  auVar5 = vcvtusi2sd_avx512f(auVar5,uVar2);
  auVar4._0_8_ = auVar5._0_8_ / 100.0;
  auVar4._8_8_ = auVar5._8_8_;
  local_88 = auVar4._0_8_;
  uVar2 = Test_Helper::randomValue<unsigned_int>(0x1d6047);
  auVar5 = vcvtusi2sd_avx512f(auVar4,uVar2);
  local_90 = auVar5._0_8_ / 100.0;
  (*local_8)(local_88,local_90,local_b8,local_38,local_70,local_74,local_78,local_7c);
  dVar10 = local_88;
  dVar3 = pow((double)local_9 / 255.0,local_90);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar10 * dVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x406fe00000000000),auVar5,ZEXT816(0x3fe0000000000000));
  if (256.0 <= auVar5._0_8_) {
    uVar7 = 0xff;
  }
  else {
    uVar7 = (ushort)(int)auVar5._0_8_ & 0xff;
  }
  uVar9 = 0;
  uVar8 = 0;
  bVar1 = Unit_Test::equalSize
                    ((Image *)(ulong)CONCAT24(uVar7,CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      CONCAT11(
                                                  in_stack_ffffffffffffff11,
                                                  in_stack_ffffffffffffff10)))),
                     in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
  bVar6 = false;
  if (bVar1) {
    bVar6 = Unit_Test::verifyImage
                      ((Image *)CONCAT17(uVar9,CONCAT16(uVar8,CONCAT24(uVar7,CONCAT13(bVar1,(uint3)
                                                  CONCAT11(in_stack_ffffffffffffff11,
                                                           in_stack_ffffffffffffff10))))),
                       (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d6190);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d619d);
  return (bool)(bVar6 & 1);
}

Assistant:

bool form3_GammaCorrection(GammaCorrectionForm3 GammaCorrection)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const double a     = randomValue <uint32_t>( 100 ) / 100.0;
        const double gamma = randomValue <uint32_t>( 300 ) / 100.0;

        const PenguinV_Image::Image output = GammaCorrection( input, roiX, roiY, roiWidth, roiHeight, a, gamma );

        const double value = a * pow( intensity / 255.0, gamma ) * 255 + 0.5;
        const uint8_t corrected = (value < 256) ? static_cast<uint8_t>(value) : 255;

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, corrected );
    }